

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O3

bool __thiscall
glcts::GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::checkResult
          (GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *this,CapturedVaryings *captured_data
          ,uint index,uint tex_size)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TestLog *this_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  GLint y_offsets [4];
  GLint x_offsets [4];
  GLint expected_values_0 [4];
  GLint expected_values_3 [4];
  GLint expected_values_2 [4];
  GLint expected_values_1 [4];
  GLint local_258 [4];
  GLint local_248 [4];
  string local_238;
  string local_218;
  int local_1f8 [4];
  int aiStack_1e8 [4];
  int aiStack_1d8 [4];
  int aiStack_1c8 [6];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_248[0] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  local_248[1] = local_248[0];
  local_248[2] = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
                 super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  local_248[3] = local_248[2];
  local_258[0] = local_248[0];
  local_258[1] = local_248[2];
  local_258[2] = local_248[0];
  local_258[3] = local_248[2];
  lVar8 = 0;
  do {
    if (local_248[lVar8] < 0) {
      local_248[lVar8] = local_248[lVar8] % (int)tex_size + tex_size;
    }
    if (local_258[lVar8] < 0) {
      local_258[lVar8] = local_258[lVar8] % (int)tex_size + tex_size;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  iVar2 = captured_data->without_offset_0[3];
  iVar3 = captured_data->without_offset_1[3];
  iVar4 = captured_data->without_offset_2[3];
  iVar5 = captured_data->without_offset_3[3];
  lVar8 = 0;
  do {
    *(int *)((long)local_1f8 + lVar8) = (iVar2 + *(int *)((long)local_248 + lVar8)) % (int)tex_size;
    *(int *)((long)aiStack_1c8 + lVar8) =
         (iVar3 + *(int *)((long)local_258 + lVar8)) % (int)tex_size;
    *(int *)((long)aiStack_1d8 + lVar8) =
         (*(int *)((long)local_248 + lVar8) + iVar4) % (int)tex_size;
    *(int *)((long)local_1f8 + lVar8 + 0x10) =
         (*(int *)((long)local_258 + lVar8) + iVar5) % (int)tex_size;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  if (captured_data->with_offset_0[0] == local_1f8[0]) {
    bVar9 = false;
    uVar7 = 0;
    do {
      if (((captured_data->with_offset_1[uVar7] != aiStack_1c8[uVar7]) ||
          (captured_data->with_offset_2[uVar7] != aiStack_1d8[uVar7])) ||
         (captured_data->with_offset_3[uVar7] != local_1f8[uVar7 + 4])) break;
      bVar9 = 2 < uVar7;
      if (uVar7 == 3) {
        return true;
      }
      lVar8 = uVar7 + 1;
      lVar6 = uVar7 + 1;
      uVar7 = uVar7 + 1;
    } while (captured_data->with_offset_0[lVar8] == local_1f8[lVar6]);
  }
  else {
    bVar9 = false;
  }
  this_00 = ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
             super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
             super_TestNode.m_testCtx)->m_log;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Invalid result","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,0x1aee929);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_218,&local_238);
  tcu::TestLog::startSection(this_00,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  GPUShader5TextureGatherOffsetTestBase::logCoordinates
            ((GPUShader5TextureGatherOffsetTestBase *)this,index);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
        super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.super_TestNode
       .m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Texture size: ",0xe);
  std::ostream::operator<<(poVar1,tex_size);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetColorTestBase).
        super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.super_TestNode
       .m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Offsets: ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
  std::ostream::operator<<(poVar1,local_248[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_258[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
  std::ostream::operator<<(poVar1,local_248[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_258[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
  std::ostream::operator<<(poVar1,local_248[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_258[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
  std::ostream::operator<<(poVar1,local_248[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_258[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  GPUShader5TextureGatherOffsetColorTestBase::logVaryings
            (&this->super_GPUShader5TextureGatherOffsetColorTestBase,captured_data);
  tcu::TestLog::endSection
            (((this->super_GPUShader5TextureGatherOffsetColorTestBase).
              super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  return bVar9;
}

Assistant:

bool GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::checkResult(const CapturedVaryings& captured_data,
																	  unsigned int index, unsigned int tex_size)
{
	/* Signed int value has to be used with operator % in order to work as expected */
	const glw::GLint texture_size = (glw::GLint)tex_size;

	/* X and Y offsets */
	glw::GLint x_offsets[m_n_components_per_varying] = {
		m_min_texture_gather_offset, m_min_texture_gather_offset, m_max_texture_gather_offset,
		m_max_texture_gather_offset,
	};

	glw::GLint y_offsets[m_n_components_per_varying] = {
		m_min_texture_gather_offset, m_max_texture_gather_offset, m_min_texture_gather_offset,
		m_max_texture_gather_offset,
	};

	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		/* Roll x offsets around left edge when negative */
		if (0 > x_offsets[i])
		{
			x_offsets[i] = x_offsets[i] % texture_size;
			x_offsets[i] += texture_size;
		}

		/* Roll y offsets around top edge when negative */
		if (0 > y_offsets[i])
		{
			y_offsets[i] = y_offsets[i] % texture_size;
			y_offsets[i] += texture_size;
		}
	}

	/* Storage for expected values of with_offset varyings */
	glw::GLint expected_values_0[m_n_components_per_varying];
	glw::GLint expected_values_1[m_n_components_per_varying];
	glw::GLint expected_values_2[m_n_components_per_varying];
	glw::GLint expected_values_3[m_n_components_per_varying];

	/* Calculate expected values of with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		expected_values_0[i] = ((x_offsets[i] + captured_data.without_offset_0[3]) % texture_size);
		expected_values_1[i] = ((y_offsets[i] + captured_data.without_offset_1[3]) % texture_size);
		expected_values_2[i] = ((x_offsets[i] + captured_data.without_offset_2[3]) % texture_size);
		expected_values_3[i] = ((y_offsets[i] + captured_data.without_offset_3[3]) % texture_size);
	}

	/* Verify that expected_values match those in with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if ((captured_data.with_offset_0[i] != expected_values_0[i]) ||
			(captured_data.with_offset_1[i] != expected_values_1[i]) ||
			(captured_data.with_offset_2[i] != expected_values_2[i]) ||
			(captured_data.with_offset_3[i] != expected_values_3[i]))
		{
			/* Log invalid results */
			m_testCtx.getLog() << tcu::TestLog::Section("Invalid result", "");

			logCoordinates(index);

			m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

			m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: "
							   << "(" << x_offsets[0] << ", " << y_offsets[0] << ") "
							   << "(" << x_offsets[1] << ", " << y_offsets[1] << ") "
							   << "(" << x_offsets[2] << ", " << y_offsets[2] << ") "
							   << "(" << x_offsets[3] << ", " << y_offsets[3] << ") " << tcu::TestLog::EndMessage;

			logVaryings(captured_data);

			m_testCtx.getLog() << tcu::TestLog::EndSection;

			/* Done */
			return false;
		}
	}

	/* Done */
	return true;
}